

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

int __thiscall MeCab::anon_unknown_0::ModelImpl::open(ModelImpl *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int iVar2;
  Writer *this_00;
  char *pcVar3;
  ulong uVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar5;
  int __oflag_00;
  int __oflag_01;
  double dVar6;
  string error;
  Param *in_stack_00000048;
  Param *in_stack_ffffffffffffff90;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  ModelImpl *local_10;
  undefined1 local_1;
  
  local_18 = __file;
  local_10 = this;
  this_00 = scoped_ptr<MeCab::Writer>::operator->(&this->writer_);
  uVar1 = Writer::open(this_00,local_18,__oflag_00);
  if (((uVar1 & 1) == 0) ||
     (uVar1 = Viterbi::open(this->viterbi_,local_18,__oflag_01), (uVar1 & 1) == 0)) {
    pcVar3 = Viterbi::what((Viterbi *)0x147bed);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar3,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::append((char *)local_38);
    }
    scoped_ptr<MeCab::Writer>::operator->(&this->writer_);
    Writer::what((Writer *)0x147c9d);
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::c_str();
    setGlobalError((char *)0x147cc5);
    local_1 = 0;
    std::__cxx11::string::~string(local_38);
    uVar5 = extraout_var;
  }
  else {
    iVar2 = load_request_type(in_stack_ffffffffffffff90);
    this->request_type_ = iVar2;
    dVar6 = Param::get<double>(in_stack_00000048,_error);
    this->theta_ = dVar6;
    local_1 = is_available((ModelImpl *)in_stack_ffffffffffffff90);
    uVar5 = extraout_var_00;
  }
  return (uint)CONCAT71(uVar5,local_1) & 0xffffff01;
}

Assistant:

bool ModelImpl::open(const Param &param) {
  if (!writer_->open(param) || !viterbi_->open(param)) {
    std::string error = viterbi_->what();
    if (!error.empty()) {
      error.append(" ");
    }
    error.append(writer_->what());
    setGlobalError(error.c_str());
    return false;
  }

  request_type_ = load_request_type(param);
  theta_ = param.get<double>("theta");

  return is_available();
}